

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

ParsedParameterVector * __thiscall
pbrt::
parseParameters<std::function<pstd::optional<pbrt::Token>(int)>,pbrt::parse(pbrt::SceneRepresentation*,std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>)::__5>
          (ParsedParameterVector *__return_storage_ptr__,pbrt *this,
          function<pstd::optional<pbrt::Token>_(int)> *nextToken,anon_class_8_1_6da50f9a ungetToken,
          Allocator alloc,bool formatting,
          function<void_(const_pbrt::Token_&,_const_char_*)> *errorCallback)

{
  bool bVar1;
  string_view sVar2;
  ParsedParameter *pPVar3;
  undefined8 uVar4;
  int iVar5;
  memory_resource *pmVar6;
  size_t sVar8;
  optional<pbrt::Token> *poVar9;
  anon_class_8_1_6da50f9a aVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b;
  optional<pbrt::Token> *poVar12;
  optional<pbrt::Token> *poVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  undefined7 in_register_00000089;
  optional<pbrt::Token> *poVar14;
  long lVar15;
  undefined1 auVar16 [16];
  string_view sVar17;
  ParsedParameter *param;
  string ret;
  ValType valType;
  optional<pbrt::Token> t;
  Token val;
  anon_class_24_3_4da73ed2 addVal;
  ParsedParameter *local_110;
  string local_108;
  int local_e8;
  int iStack_e4;
  char local_e0;
  undefined4 local_d0;
  undefined4 local_cc;
  ParsedParameterVector *local_c8;
  optional<pbrt::Token> *local_c0;
  ValType local_b4;
  optional<pbrt::Token> *local_b0;
  Token local_a8;
  char local_80;
  Token local_78;
  function<void_(const_pbrt::Token_&,_const_char_*)> *local_50;
  anon_class_24_3_4da73ed2 local_48;
  size_t sVar7;
  char *pcVar11;
  
  local_50 = (function<void_(const_pbrt::Token_&,_const_char_*)> *)
             CONCAT71(in_register_00000089,formatting);
  local_cc = SUB84(alloc.memoryResource,0);
  aVar10.ungetToken = ungetToken.ungetToken;
  pmVar6 = pstd::pmr::new_delete_resource();
  (__return_storage_ptr__->alloc).memoryResource = pmVar6;
  __return_storage_ptr__->ptr = (ParsedParameter **)0x0;
  __return_storage_ptr__->nAlloc = 0;
  __return_storage_ptr__->nStored = 0;
  local_c0 = (optional<pbrt::Token> *)0x0;
  local_c8 = __return_storage_ptr__;
  local_b0 = ungetToken.ungetToken;
  do {
    local_108._M_dataplus._M_p = local_108._M_dataplus._M_p & 0xffffffff00000000;
    if (*(long *)(this + 0x10) == 0) {
      std::__throw_bad_function_call();
    }
    (**(code **)(this + 0x18))(&local_a8,this,&local_108);
    if (local_80 == '\0') {
LAB_003bd1ad:
      bVar1 = false;
      aVar10.ungetToken = (optional<pbrt::Token> *)CONCAT71((int7)((ulong)aVar10.ungetToken >> 8),1)
      ;
      local_c0 = aVar10.ungetToken;
    }
    else {
      if (((local_a8.token._M_len < 2) ||
          (aVar10.ungetToken = (optional<pbrt::Token> *)local_a8.token._M_str,
          ((aligned_storage_t<sizeof(pbrt::Token),_alignof(pbrt::Token)> *)local_a8.token._M_str)->
          __data[0] != '\"')) ||
         (*(char *)((long)local_a8.token._M_str + (local_a8.token._M_len - 1)) != '\"')) {
        if (nextToken[1].super__Function_base._M_functor._M_pod_data[8] == '\x01') {
          LogFatal<char_const(&)[24]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp"
                     ,0x244,"Check failed: %s",(char (*) [24])"!ungetToken.has_value()");
        }
        *(undefined8 *)&nextToken[1].super__Function_base._M_functor = local_a8.loc._16_8_;
        *(size_t *)&(nextToken->super__Function_base)._M_functor = local_a8.token._M_len;
        *(char **)((long)&(nextToken->super__Function_base)._M_functor + 8) = local_a8.token._M_str;
        (nextToken->super__Function_base)._M_manager = (_Manager_type)local_a8.loc.filename._M_len;
        nextToken->_M_invoker = (_Invoker_type)local_a8.loc.filename._M_str;
        nextToken[1].super__Function_base._M_functor._M_pod_data[8] = '\x01';
        goto LAB_003bd1ad;
      }
      local_110 = (ParsedParameter *)
                  (**(code **)((long)((ungetToken.ungetToken)->optionalValue).__align + 0x10))
                            (ungetToken.ungetToken,0xd0,8);
      local_108.field_2._M_allocated_capacity._0_4_ = local_a8.loc.line;
      local_108.field_2._M_allocated_capacity._4_4_ = local_a8.loc.column;
      local_108._M_dataplus._M_p = (pointer)local_a8.loc.filename._M_len;
      local_108._M_string_length = (size_type)local_a8.loc.filename._M_str;
      (local_110->type)._M_dataplus._M_p = (pointer)&(local_110->type).field_2;
      (local_110->type)._M_string_length = 0;
      (local_110->type).field_2._M_local_buf[0] = '\0';
      (local_110->name)._M_dataplus._M_p = (pointer)&(local_110->name).field_2;
      (local_110->name)._M_string_length = 0;
      (local_110->name).field_2._M_local_buf[0] = '\0';
      (local_110->loc).filename._M_len = local_a8.loc.filename._M_len;
      (local_110->loc).filename._M_str = local_a8.loc.filename._M_str;
      (local_110->loc).line = local_a8.loc.line;
      (local_110->loc).column = local_a8.loc.column;
      (local_110->numbers).alloc.memoryResource = (memory_resource *)ungetToken.ungetToken;
      auVar16 = ZEXT816(0) << 0x20;
      (local_110->numbers).ptr = (double *)auVar16._0_8_;
      (local_110->numbers).nAlloc = auVar16._8_8_;
      (local_110->numbers).nStored = 0;
      (local_110->strings).alloc.memoryResource = (memory_resource *)ungetToken.ungetToken;
      (local_110->strings).ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auVar16._0_8_;
      (local_110->strings).nAlloc = auVar16._8_8_;
      (local_110->strings).nStored = 0;
      (local_110->bools).alloc.memoryResource = (memory_resource *)ungetToken.ungetToken;
      local_110->colorSpace = (RGBColorSpace *)0x0;
      local_110->mayBeUnused = false;
      *(undefined1 (*) [16])((long)&(local_110->bools).nAlloc + 1) = auVar16;
      (local_110->bools).ptr = (uchar *)auVar16._0_8_;
      (local_110->bools).nAlloc = auVar16._8_8_;
      if (local_80 == '\0') {
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
      }
      sVar17 = dequoteString(&local_a8);
      pcVar11 = sVar17._M_str;
      sVar7 = sVar17._M_len;
      poVar14 = (optional<pbrt::Token> *)(pcVar11 + sVar7);
      sVar2 = sVar17;
      while (poVar9 = (optional<pbrt::Token> *)sVar2._M_str, sVar2._M_len != 0) {
        poVar9 = (optional<pbrt::Token> *)sVar17._M_str;
        if (((poVar9->optionalValue).__data[0] != ' ') &&
           ((poVar9->optionalValue).__data[0] != '\t')) break;
        sVar8 = sVar17._M_len - 1;
        sVar2._M_str = (char *)poVar14;
        sVar2._M_len = sVar8;
        sVar17._M_str = (char *)((long)&poVar9->optionalValue + 1);
        sVar17._M_len = sVar8;
      }
      if (poVar9 == poVar14) {
        if (local_80 != '\0') {
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,pcVar11,poVar14);
          ErrorExit<std::__cxx11::string>
                    (&local_a8.loc,"Parameter \"%s\" doesn\'t have a type declaration?!",&local_108)
          ;
        }
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
      }
      poVar12 = poVar9;
      do {
        poVar13 = poVar12;
        if (((poVar12->optionalValue).__data[0] == '\t') ||
           ((poVar12->optionalValue).__data[0] == ' ')) break;
        poVar12 = (optional<pbrt::Token> *)((long)&poVar12->optionalValue + 1);
        poVar13 = (optional<pbrt::Token> *)(pcVar11 + sVar7);
      } while (poVar12 != poVar14);
      std::__cxx11::string::replace
                ((ulong)local_110,0,(char *)(local_110->type)._M_string_length,(ulong)poVar9);
      if ((char)local_cc != '\0') {
        iVar5 = std::__cxx11::string::compare((char *)local_110);
        if (iVar5 == 0) {
          std::__cxx11::string::_M_replace
                    ((ulong)local_110,0,(char *)(local_110->type)._M_string_length,0x5e4317);
        }
        iVar5 = std::__cxx11::string::compare((char *)local_110);
        if (iVar5 == 0) {
          std::__cxx11::string::_M_replace
                    ((ulong)local_110,0,(char *)(local_110->type)._M_string_length,0xa9b843);
        }
      }
      aVar10.ungetToken = poVar13;
      if (poVar14 != poVar13) {
        do {
          if (((poVar13->optionalValue).__data[0] != ' ') &&
             (aVar10.ungetToken = poVar13, (poVar13->optionalValue).__data[0] != '\t')) break;
          poVar13 = (optional<pbrt::Token> *)((long)&poVar13->optionalValue + 1);
          aVar10.ungetToken = (optional<pbrt::Token> *)(pcVar11 + sVar7);
        } while (poVar13 != poVar14);
      }
      poVar9 = aVar10.ungetToken;
      if (aVar10.ungetToken == poVar14) {
        if (local_80 != '\0') {
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,pcVar11,poVar14);
          ErrorExit<std::__cxx11::string>
                    (&local_a8.loc,"Unable to find parameter name from \"%s\"",&local_108);
        }
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
      }
      do {
        if (((poVar9->optionalValue).__data[0] == '\t') ||
           ((poVar9->optionalValue).__data[0] == ' ')) break;
        poVar9 = (optional<pbrt::Token> *)((long)&poVar9->optionalValue + 1);
      } while (poVar9 != poVar14);
      std::__cxx11::string::replace
                ((ulong)&local_110->name,0,(char *)(local_110->name)._M_string_length,
                 (ulong)aVar10.ungetToken);
      ungetToken.ungetToken = local_b0;
      local_48.param = &local_110;
      local_b4 = Unknown;
      local_48.valType = &local_b4;
      local_48.errorCallback = local_50;
      local_d0 = 1;
      if (*(long *)(this + 0x10) == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)(this + 0x18))(&local_108,this,&local_d0);
      if (local_e0 == '\0') {
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
      }
      local_78.loc.line = local_e8;
      local_78.loc.column = iStack_e4;
      local_78.token._M_len = (size_t)local_108._M_dataplus._M_p;
      local_78.token._M_str = (char *)local_108._M_string_length;
      local_78.loc.filename._M_len = local_108.field_2._M_allocated_capacity;
      local_78.loc.filename._M_str = (char *)local_108.field_2._8_8_;
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_108._M_dataplus._M_p ==
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x1) && (iVar5 = bcmp((void *)local_108._M_string_length,"[",1), iVar5 == 0)) {
        while( true ) {
          local_d0 = 1;
          if (*(long *)(this + 0x10) == 0) {
            std::__throw_bad_function_call();
          }
          (**(code **)(this + 0x18))(&local_108,this,&local_d0);
          if (local_e0 == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
          }
          uVar4._0_4_ = local_e8;
          uVar4._4_4_ = iStack_e4;
          local_78.loc.line = local_e8;
          local_78.loc.column = iStack_e4;
          local_78.token._M_len = (size_t)local_108._M_dataplus._M_p;
          local_78.token._M_str = (char *)local_108._M_string_length;
          local_78.loc.filename._M_len = local_108.field_2._M_allocated_capacity;
          local_78.loc.filename._M_str = (char *)local_108.field_2._8_8_;
          if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_108._M_dataplus._M_p ==
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x1) &&
             (iVar5 = bcmp((void *)local_108._M_string_length,"]",1), uVar4 = local_78.loc._16_8_,
             iVar5 == 0)) break;
          local_78.loc._16_8_ = uVar4;
          parseParameters<std::function<pstd::optional<pbrt::Token>_(int)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:579:18)>
          ::anon_class_24_3_4da73ed2::operator()(&local_48,&local_78);
        }
      }
      else {
        parseParameters<std::function<pstd::optional<pbrt::Token>_(int)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:579:18)>
        ::anon_class_24_3_4da73ed2::operator()(&local_48,&local_78);
      }
      if (((char)local_cc != '\0') &&
         (iVar5 = std::__cxx11::string::compare((char *)local_110), iVar5 == 0)) {
        sVar7 = (local_110->strings).nStored;
        if (sVar7 != 0) {
          v = (local_110->strings).ptr;
          lVar15 = sVar7 << 5;
          do {
            iVar5 = std::__cxx11::string::compare((char *)v);
            if (iVar5 == 0) {
              local_108._M_dataplus._M_p._0_1_ = 1;
              pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::
              push_back(&local_110->bools,(uchar *)&local_108);
            }
            else {
              iVar5 = std::__cxx11::string::compare((char *)v);
              pPVar3 = local_110;
              if (iVar5 == 0) {
                local_108._M_dataplus._M_p = local_108._M_dataplus._M_p & 0xffffffffffffff00;
                pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::
                push_back(&local_110->bools,(uchar *)&local_108);
              }
              else {
                local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                local_108._M_string_length = 0;
                local_108.field_2._M_allocated_capacity =
                     local_108.field_2._M_allocated_capacity & 0xffffffffffffff00;
                detail::stringPrintfRecursive<std::__cxx11::string_const&>
                          (&local_108,"%s: neither \"true\" nor \"false\" in bool parameter list.",v
                          );
                Error(&pPVar3->loc,local_108._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108._M_dataplus._M_p != &local_108.field_2) {
                  operator_delete(local_108._M_dataplus._M_p,
                                  local_108.field_2._M_allocated_capacity + 1);
                }
              }
            }
            v = v + 1;
            lVar15 = lVar15 + -0x20;
          } while (lVar15 != 0);
        }
        pstd::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&local_110->strings);
        ungetToken.ungetToken = local_b0;
      }
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::push_back(local_c8,&local_110);
      bVar1 = true;
    }
    if (local_80 == '\x01') {
      local_80 = '\0';
    }
    if (!bVar1) {
      if (((ulong)local_c0 & 1) == 0) {
        InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
        ::~InlinedVector(local_c8);
      }
      return local_c8;
    }
  } while( true );
}

Assistant:

static ParsedParameterVector parseParameters(
    Next nextToken, Unget ungetToken, Allocator alloc, bool formatting,
    const std::function<void(const Token &token, const char *)> &errorCallback) {
    ParsedParameterVector parameterVector;

    while (true) {
        pstd::optional<Token> t = nextToken(TokenOptional);
        if (!t.has_value())
            return parameterVector;

        if (!isQuotedString(t->token)) {
            ungetToken(*t);
            return parameterVector;
        }

        ParsedParameter *param = alloc.new_object<ParsedParameter>(alloc, t->loc);

        std::string_view decl = dequoteString(*t);

        auto skipSpace = [&decl](std::string_view::const_iterator iter) {
            while (iter != decl.end() && (*iter == ' ' || *iter == '\t'))
                ++iter;
            return iter;
        };
        // Skip to the next whitespace character (or the end of the string).
        auto skipToSpace = [&decl](std::string_view::const_iterator iter) {
            while (iter != decl.end() && *iter != ' ' && *iter != '\t')
                ++iter;
            return iter;
        };

        auto typeBegin = skipSpace(decl.begin());
        if (typeBegin == decl.end())
            ErrorExit(&t->loc, "Parameter \"%s\" doesn't have a type declaration?!",
                      std::string(decl.begin(), decl.end()));

        // Find end of type declaration
        auto typeEnd = skipToSpace(typeBegin);
        param->type.assign(typeBegin, typeEnd);

        if (formatting) {  // close enough: upgrade...
            if (param->type == "point")
                param->type = "point3";
            if (param->type == "color")
                param->type = "rgb";
        }

        auto nameBegin = skipSpace(typeEnd);
        if (nameBegin == decl.end())
            ErrorExit(&t->loc, "Unable to find parameter name from \"%s\"",
                      std::string(decl.begin(), decl.end()));

        auto nameEnd = skipToSpace(nameBegin);
        param->name.assign(nameBegin, nameEnd);

        enum ValType { Unknown, String, Bool, Number } valType = Unknown;

        auto addVal = [&](const Token &t) {
            if (isQuotedString(t.token)) {
                switch (valType) {
                case Unknown:
                    valType = String;
                    break;
                case String:
                    break;
                case Number:
                    errorCallback(t, "expected number");
                case Bool:
                    errorCallback(t, "expected bool");
                }

                param->AddString(dequoteString(t));
            } else if (t.token[0] == 't' && t.token == "true") {
                switch (valType) {
                case Unknown:
                    valType = Bool;
                    break;
                case String:
                    errorCallback(t, "expected string");
                case Number:
                    errorCallback(t, "expected number");
                case Bool:
                    break;
                }

                param->AddBool(true);
            } else if (t.token[0] == 'f' && t.token == "false") {
                switch (valType) {
                case Unknown:
                    valType = Bool;
                    break;
                case String:
                    errorCallback(t, "expected string");
                case Number:
                    errorCallback(t, "expected number");
                case Bool:
                    break;
                }

                param->AddBool(false);
            } else {
                switch (valType) {
                case Unknown:
                    valType = Number;
                    break;
                case String:
                    errorCallback(t, "expected string");
                case Number:
                    break;
                case Bool:
                    errorCallback(t, "expected bool");
                }

                param->AddNumber(parseNumber(t));
            }
        };

        Token val = *nextToken(TokenRequired);

        if (val.token == "[") {
            while (true) {
                val = *nextToken(TokenRequired);
                if (val.token == "]")
                    break;
                addVal(val);
            }
        } else {
            addVal(val);
        }

        if (formatting && param->type == "bool") {
            for (const auto &b : param->strings) {
                if (b == "true")
                    param->bools.push_back(true);
                else if (b == "false")
                    param->bools.push_back(false);
                else
                    Error(&param->loc,
                          "%s: neither \"true\" nor \"false\" in bool "
                          "parameter list.",
                          b);
            }
            param->strings.clear();
        }

        parameterVector.push_back(param);
    }

    return parameterVector;
}